

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Options::ListOptionParser::optionDescription_abi_cxx11_
          (string *__return_storage_ptr__,ListOptionParser *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "With no arguments this option will list all registered tests - one per line.\nSupplying the xml argument formats the list as an xml document (which may be useful for consumption by other tools).\nSupplying the tests or reporters lists tests or reporters respectively - with descriptions.\n\nExamples:\n\n    -l\n    -l tests\n    -l reporters xml\n    -l xml"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string optionDescription() const {
                return
                    "With no arguments this option will list all registered tests - one per line.\n"
                    "Supplying the xml argument formats the list as an xml document (which may be useful for "
                    "consumption by other tools).\n"
                    "Supplying the tests or reporters lists tests or reporters respectively - with descriptions.\n"
                    "\n"
                    "Examples:\n"
                    "\n"
                    "    -l\n"
                    "    -l tests\n"
                    "    -l reporters xml\n"
                    "    -l xml";
            }